

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  int64_t iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t iVar4;
  undefined4 extraout_var_00;
  int64_t iVar5;
  undefined4 extraout_var_01;
  Nonnull<const_char_*> pcVar6;
  LogMessage *pLVar7;
  unsigned_long v1_00;
  string_view str;
  string_view sVar8;
  LogMessage LStack_48;
  ulong local_38;
  ulong v1;
  
  iVar3 = (*this->_vptr_MessageLite[3])();
  v1 = CONCAT44(extraout_var,iVar3);
  if ((v1 & 0xffffffff80000000) == 0) {
    iVar4 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
    iVar1 = output->start_count_;
    iVar3 = (*this->_vptr_MessageLite[5])(this,output->cur_,output);
    output->cur_ = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
    bVar2 = io::CodedOutputStream::HadError(output);
    if (!bVar2) {
      iVar5 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
      v1_00 = (unsigned_long)(((int)iVar1 + (int)iVar5) - ((int)iVar4 + (int)output->start_count_));
      if (v1 != v1_00) {
        iVar3 = (*this->_vptr_MessageLite[3])(this);
        if (v1 == CONCAT44(extraout_var_01,iVar3)) {
          pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                             (v1_00,v1,
                              "bytes_produced_by_serialization == byte_size_before_serialization");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                     ,0xab,pcVar6);
          str._M_str = 
          "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
          ;
          str._M_len = 0x9a;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&LStack_48,str);
          sVar8 = GetTypeName(this);
          pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,sVar8);
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,(char (*) [2])0x3143ec);
        }
        else {
          pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                             (v1,CONCAT44(extraout_var_01,iVar3),
                              "byte_size_before_serialization == byte_size_after_serialization");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                     ,0xa8,pcVar6);
          sVar8 = GetTypeName(this);
          pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,sVar8);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (pLVar7,(char (*) [49])" was modified concurrently during serialization.");
        }
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&LStack_48);
      }
    }
    bVar2 = !bVar2;
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x201);
    sVar8 = GetTypeName(this);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,sVar8);
    sVar8._M_str = " exceeded maximum protobuf size of 2GB: ";
    sVar8._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar7,sVar8);
    local_38 = v1;
    absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>(pLVar7,&local_38);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_48);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != static_cast<int64_t>(size)) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}